

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_log.c
# Opt level: O0

int LogInitialize(LogConfig logConfig)

{
  int in_stack_00000008;
  int in_stack_0000000c;
  
  g_log_config.enable_time = in_stack_00000008;
  g_log_config.enable_thread_id = in_stack_0000000c;
  g_log_config.enable_function_line = logConfig.enable_time;
  g_log_config.enable_color = logConfig.enable_thread_id;
  g_log_config.set_level = logConfig.enable_function_line;
  uni_mutex_new(&g_mutex);
  g_inited = 1;
  return 0;
}

Assistant:

int LogInitialize(LogConfig logConfig) {
  g_log_config.enable_time          = logConfig.enable_time;
  g_log_config.enable_thread_id     = logConfig.enable_thread_id;
  g_log_config.enable_function_line = logConfig.enable_function_line;
  g_log_config.enable_color         = logConfig.enable_color;
  g_log_config.set_level            = logConfig.set_level;

  uni_mutex_new(&g_mutex);
  g_inited = 1;
  return 0;
}